

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall
QGridLayout::addLayout
          (QGridLayout *this,QLayout *layout,int row,int column,int rowSpan,int columnSpan,
          Alignment alignment)

{
  QGridLayoutPrivate *this_00;
  int row2;
  int col2;
  bool bVar1;
  QGridBox *box;
  QLayoutItem *this_01;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkLayout(&this_00->super_QLayoutPrivate,layout);
  if (bVar1) {
    bVar1 = QLayout::adoptLayout(&this->super_QLayout,layout);
    if (bVar1) {
      box = (QGridBox *)operator_new(0x18);
      this_01 = &layout->super_QLayoutItem;
      if (layout == (QLayout *)0x0) {
        this_01 = (QLayoutItem *)0x0;
      }
      box->item_ = this_01;
      QLayoutItem::setAlignment(this_01,alignment);
      row2 = row + rowSpan + -1;
      if (rowSpan < 0) {
        row2 = -1;
      }
      col2 = column + columnSpan + -1;
      if (columnSpan < 0) {
        col2 = -1;
      }
      QGridLayoutPrivate::add(this_00,box,row,row2,column,col2);
      return;
    }
  }
  return;
}

Assistant:

void QGridLayout::addLayout(QLayout *layout, int row, int column,
                                      int rowSpan, int columnSpan, Qt::Alignment alignment)
{
    Q_D(QGridLayout);
    if (!d->checkLayout(layout))
        return;
    if (!adoptLayout(layout))
        return;
    QGridBox *b = new QGridBox(layout);
    b->setAlignment(alignment);
    d->add(b, row, (rowSpan < 0) ? -1 : row + rowSpan - 1, column, (columnSpan < 0) ? -1 : column + columnSpan - 1);
}